

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::RecyclableArgumentsArrayWalker::Get
          (RecyclableArgumentsArrayWalker *this,int i,ResolvedObject *pResolvedObject)

{
  WriteBarrierPtr<void> *pWVar1;
  StringBuilder<Memory::ArenaAllocator> *object;
  Var pvVar2;
  code *pcVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  Type *ppDVar9;
  Type *ppIVar10;
  undefined8 uVar11;
  BVSparse<Memory::Recycler> *pBVar12;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar13;
  RecyclableArgumentsArrayAddress *this_00;
  TrackAllocData local_78;
  StringBuilder<Memory::ArenaAllocator> *local_50;
  StringBuilder<Memory::ArenaAllocator> *builder;
  HeapArgumentsObject *argObj;
  ResolvedObject *pResolvedObject_local;
  RecyclableArgumentsArrayWalker *pRStack_30;
  int i_local;
  RecyclableArgumentsArrayWalker *this_local;
  Var local_20;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  argObj = (HeapArgumentsObject *)pResolvedObject;
  pResolvedObject_local._4_4_ = i;
  pRStack_30 = this;
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc56,"(pResolvedObject)",
                                "Bad usage of RecyclableArgumentsArrayWalker::Get");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (pResolvedObject_local._4_4_ < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc58,"(i >= 0)","i >= 0");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  bVar5 = VarIs<Js::ArgumentsObject>
                    ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc59,"(Js::VarIs<Js::ArgumentsObject>(instance))",
                                "Js::VarIs<Js::ArgumentsObject>(instance)");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  iVar4 = pResolvedObject_local._4_4_;
  if (((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList ==
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) ||
     (iVar6 = JsUtil::
              ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
              ::Count(&((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                       pMembersList)->
                       super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ), iVar6 <= iVar4)) {
    this_local._4_4_ = 0;
  }
  else {
    ppDVar9 = JsUtil::
              List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList,
                     pResolvedObject_local._4_4_);
    if (*ppDVar9 == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xc5d,"(pMembersList->Item(i) != nullptr)",
                                  "pMembersList->Item(i) != nullptr");
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    iVar4 = pResolvedObject_local._4_4_;
    (argObj->super_ArgumentsObject).super_DynamicObject.auxSlots.ptr = (WriteBarrierPtr<void> *)0x0;
    if ((this->pFormalsList ==
         (List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0) ||
       (iVar6 = JsUtil::
                ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>::
                Count(&this->pFormalsList->
                       super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ), iVar6 <= iVar4)) {
      ppDVar9 = JsUtil::
                List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList
                       ,pResolvedObject_local._4_4_);
      *(Var *)&argObj->field_0x20 = (*ppDVar9)->aVar;
    }
    else {
      ppIVar10 = JsUtil::
                 List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->pFormalsList,pResolvedObject_local._4_4_);
      (argObj->super_ArgumentsObject).super_DynamicObject.auxSlots.ptr =
           (WriteBarrierPtr<void> *)*ppIVar10;
      pWVar1 = (argObj->super_ArgumentsObject).super_DynamicObject.auxSlots.ptr;
      uVar11 = (**(code **)((long)pWVar1->ptr + 0x10))(pWVar1,0);
      *(undefined8 *)&argObj->field_0x20 = uVar11;
      if (*(long *)&argObj->field_0x20 == 0) {
        ppDVar9 = JsUtil::
                  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                         pMembersList,pResolvedObject_local._4_4_);
        *(Var *)&argObj->field_0x20 = (*ppDVar9)->aVar;
      }
      else {
        pvVar2 = *(Var *)&argObj->field_0x20;
        ppDVar9 = JsUtil::
                  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                         pMembersList,pResolvedObject_local._4_4_);
        if (pvVar2 != (*ppDVar9)->aVar) {
          object = (StringBuilder<Memory::ArenaAllocator> *)
                   (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance;
          pvVar2 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance;
          builder = object;
          ppDVar9 = JsUtil::
                    List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                           pMembersList,pResolvedObject_local._4_4_);
          Js::JavascriptOperators::SetItem
                    (pvVar2,(RecyclableObject *)object,(*ppDVar9)->propId,
                     *(Var *)&argObj->field_0x20,
                     (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.scriptContext,
                     PropertyOperation_None,0);
        }
      }
    }
    if (*(long *)&argObj->field_0x20 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xc74,"(pResolvedObject->obj)","pResolvedObject->obj");
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    (argObj->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.type.ptr =
         (Type *)(this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.scriptContext;
    local_20 = *(Var *)&argObj->field_0x20;
    if (local_20 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    bVar5 = TaggedInt::Is(local_20);
    if (bVar5) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar5 = JavascriptNumber::Is_NoTaggedIntCheck(local_20);
      if (bVar5) {
        local_18 = TypeIds_Number;
      }
      else {
        pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_20);
        if (pRStack_10 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_14 = RecyclableObject::GetTypeId(pRStack_10);
        if ((0x57 < (int)local_14) && (BVar7 = RecyclableObject::IsExternal(pRStack_10), BVar7 == 0)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_18 = local_14;
      }
    }
    *(TypeId *)
     &argObj[1].super_ArgumentsObject.super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = local_18;
    local_50 = RecyclableArrayWalker::GetBuilder(&this->super_RecyclableArrayWalker);
    if (local_50 == (StringBuilder<Memory::ArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xc7a,"(builder)","builder");
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    StringBuilder<Memory::ArenaAllocator>::Reset(local_50);
    ppDVar9 = JsUtil::
              List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList,
                     pResolvedObject_local._4_4_);
    pBVar12 = (BVSparse<Memory::Recycler> *)
              RecyclableArrayWalker::GetIndexName
                        (&this->super_RecyclableArrayWalker,(*ppDVar9)->propId,local_50);
    (argObj->deletedArgs).ptr = pBVar12;
    if ((*(int *)&argObj[1].super_ArgumentsObject.super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
         != 0x17) &&
       ((argObj->super_ArgumentsObject).super_DynamicObject.auxSlots.ptr ==
        (WriteBarrierPtr<void> *)0x0)) {
      pAVar13 = &GetArenaFromContext((this->super_RecyclableArrayWalker).
                                     super_RecyclableObjectWalker.scriptContext)->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_78,(type_info *)&RecyclableArgumentsArrayAddress::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                 ,0xc83);
      pAVar13 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo(pAVar13,&local_78);
      this_00 = (RecyclableArgumentsArrayAddress *)
                new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar13,0x3f67b0);
      pvVar2 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance;
      ppDVar9 = JsUtil::
                List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList
                       ,pResolvedObject_local._4_4_);
      RecyclableArgumentsArrayAddress::RecyclableArgumentsArrayAddress
                (this_00,pvVar2,(*ppDVar9)->propId);
      (argObj->super_ArgumentsObject).super_DynamicObject.auxSlots.ptr =
           (WriteBarrierPtr<void> *)this_00;
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL RecyclableArgumentsArrayWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        AssertMsg(pResolvedObject, "Bad usage of RecyclableArgumentsArrayWalker::Get");

        Assert(i >= 0);
        Assert(Js::VarIs<Js::ArgumentsObject>(instance));

        if (pMembersList && i < pMembersList->Count())
        {
            Assert(pMembersList->Item(i) != nullptr);

            pResolvedObject->address = nullptr;
            if (pFormalsList && i < pFormalsList->Count())
            {
                pResolvedObject->address = pFormalsList->Item(i);
                pResolvedObject->obj = pResolvedObject->address->GetValue(FALSE);
                if (pResolvedObject->obj == nullptr)
                {
                    // Temp workaround till the arguments (In jit code) work is ready.
                    pResolvedObject->obj = pMembersList->Item(i)->aVar;
                }
                else if (pResolvedObject->obj != pMembersList->Item(i)->aVar)
                {
                    // We set the formals value in the object itself, so that expression evaluation can reflect them correctly
                    Js::HeapArgumentsObject* argObj = static_cast<Js::HeapArgumentsObject*>(instance);
                    JavascriptOperators::SetItem(instance, argObj, (uint32)pMembersList->Item(i)->propId, pResolvedObject->obj, scriptContext, PropertyOperation_None);
                }
            }
            else
            {
                pResolvedObject->obj = pMembersList->Item(i)->aVar;
            }
            Assert(pResolvedObject->obj);

            pResolvedObject->scriptContext = scriptContext;
            pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);

            StringBuilder<ArenaAllocator>* builder = GetBuilder();
            Assert(builder);
            builder->Reset();
            pResolvedObject->name = GetIndexName(pMembersList->Item(i)->propId, builder);

            if (pResolvedObject->typeId != TypeIds_HostDispatch && pResolvedObject->address == nullptr)
            {
                pResolvedObject->address = Anew(GetArenaFromContext(scriptContext),
                    RecyclableArgumentsArrayAddress,
                    instance,
                    pMembersList->Item(i)->propId);
            }
            return TRUE;
        }
        return FALSE;
    }